

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O1

void __thiscall baryonyx::problem::problem(problem *this,raw_problem *pb)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  problem_solver_type pVar2;
  
  (this->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (pb->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->strings).super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  std::
  vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
  ::vector(&(this->objective).elements,&(pb->objective).elements);
  std::
  vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
  ::vector(&(this->objective).qelements,&(pb->objective).qelements);
  (this->objective).value = (pb->objective).value;
  std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::vector
            (&this->equal_constraints,&pb->equal_constraints);
  std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::vector
            (&this->greater_constraints,&pb->greater_constraints);
  std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::vector
            (&this->less_constraints,&pb->less_constraints);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::vector(&(this->vars).names,&(pb->vars).names);
  std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::vector
            (&(this->vars).values,&(pb->vars).values);
  (this->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->affected_vars).values.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->affected_vars).values.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->affected_vars).values.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->affected_vars).values.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  this->type = pb->type;
  this->problem_type = equalities_01;
  pVar2 = which_problem_type(this);
  this->problem_type = pVar2;
  return;
}

Assistant:

problem(const raw_problem& pb)
      : strings(pb.strings)
      , objective(pb.objective)
      , equal_constraints(pb.equal_constraints)
      , greater_constraints(pb.greater_constraints)
      , less_constraints(pb.less_constraints)
      , vars(pb.vars)
      , type(pb.type)
    {
        problem_type = which_problem_type();
    }